

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_client_get_tls(nng_http_client *cli,nng_tls_config **cfgp)

{
  nng_tls_config **cfgp_local;
  nng_http_client *cli_local;
  
  return NNG_ENOTSUP;
}

Assistant:

nng_err
nng_http_client_get_tls(nng_http_client *cli, nng_tls_config **cfgp)
{
#if defined(NNG_SUPP_HTTP) && defined(NNG_SUPP_TLS)
	return (nni_http_client_get_tls(cli, cfgp));
#else
	NNI_ARG_UNUSED(cli);
	NNI_ARG_UNUSED(cfgp);
	return (NNG_ENOTSUP);
#endif
}